

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,OffsetData *offset_data,uchar *head,
              size_t size,string *err)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  EXRChannelInfo *pEVar5;
  bool bVar6;
  int c;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  unsigned_long uVar10;
  TEXRImage *pTVar11;
  uchar **ppuVar12;
  size_t channel_offset_list_00;
  long lVar13;
  byte bVar14;
  int iVar15;
  bool bVar16;
  ulong uVar17;
  int level_x;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  int *piVar24;
  EXRImage *pEVar25;
  size_t y_idx;
  string local_200 [32];
  int b;
  undefined4 uStack_1dc;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  stringstream ss;
  ostream local_1a8 [376];
  
  iVar1 = exr_header->compression_type;
  iVar8 = 0x10;
  if ((iVar1 != 3) && (iVar1 != 0x80)) {
    if (iVar1 == 4) {
      iVar8 = 0x20;
    }
    else {
      iVar8 = 1;
    }
  }
  iVar1 = (exr_header->data_window).max_x;
  iVar2 = (exr_header->data_window).min_x;
  iVar7 = iVar1 - iVar2;
  if ((iVar1 < iVar2) ||
     (iVar1 = (exr_header->data_window).max_y, iVar2 = (exr_header->data_window).min_y,
     iVar19 = iVar1 - iVar2, iVar1 < iVar2)) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::string::append((char *)err);
    return -4;
  }
  iVar1 = iVar7 + 1;
  iVar2 = iVar19 + 1;
  if (0x7fffff < iVar19 || 0x7fffff < iVar7) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar9 = std::operator<<(local_1a8,"data_with or data_height too large. data_width: ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar1);
    poVar9 = std::operator<<(poVar9,", ");
    poVar9 = std::operator<<(poVar9,"data_height = ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar2);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)err);
LAB_001af53a:
    std::__cxx11::string::~string(local_200);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return -4;
  }
  iVar7 = exr_header->num_channels;
  if ((exr_header->tiled != 0) &&
     ((0x800000 < exr_header->tile_size_x || (0x800000 < exr_header->tile_size_y)))) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar9 = std::operator<<(local_1a8,"tile with or tile height too large. tile width: ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,exr_header->tile_size_x);
    poVar9 = std::operator<<(poVar9,", ");
    poVar9 = std::operator<<(poVar9,"tile height = ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,exr_header->tile_size_y);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)err);
    goto LAB_001af53a;
  }
  plVar3 = *(long **)&(((offset_data->offsets).
                        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      )._M_impl;
  lVar13 = plVar3[1];
  lVar4 = *plVar3;
  uVar17 = (ulong)iVar7;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar5 = exr_header->channels;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&channel_offset_list,uVar17);
  uVar23 = (ulong)(lVar13 - lVar4) >> 3;
  piVar24 = &pEVar5->pixel_type;
  uVar10 = 0;
  iVar19 = 0;
  for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
    channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar21] = uVar10;
    uVar22 = (ulong)(uint)*piVar24;
    if (2 < uVar22) {
      if (uVar21 < uVar17) {
        iVar8 = -4;
        if ((EXRChannelInfo *)err != (EXRChannelInfo *)0x0) {
          std::__cxx11::string::append((char *)err);
        }
        goto LAB_001afbe2;
      }
      break;
    }
    iVar19 = iVar19 + *(int *)(&DAT_00229048 + uVar22 * 4);
    uVar10 = uVar10 + *(long *)(&DAT_00229058 + uVar22 * 8);
    piVar24 = piVar24 + 0x44;
  }
  if (exr_header->tiled == 0) {
    if (0xffffffc000000000 < (long)iVar1 * uVar17 * (long)iVar2 - 0x4000000000) {
      ppuVar12 = AllocateImage(iVar7,exr_header->channels,exr_header->requested_pixel_types,iVar1,
                               iVar2);
      exr_image->images = ppuVar12;
      channel_offset_list_00 = (size_t)iVar19;
      uVar21 = 0;
      uVar17 = uVar23 & 0xffffffff;
      if ((int)uVar23 < 1) {
        uVar17 = uVar21;
      }
      bVar16 = false;
      for (; uVar17 != uVar21; uVar21 = uVar21 + 1) {
        lVar13 = *(long *)(*plVar3 + uVar21 * 8);
        bVar6 = true;
        if (lVar13 + 8U <= size) {
          iVar19 = *(int *)(head + lVar13 + 4);
          if ((ulong)(long)iVar19 <= size - (lVar13 + 8U)) {
            iVar15 = *(int *)(head + lVar13);
            if (iVar19 != 0 && 0xffbffffe < iVar15 - 0x200001U) {
              iVar18 = (exr_header->data_window).max_y + 1;
              if (iVar15 + iVar8 <= iVar18) {
                iVar18 = iVar15 + iVar8;
              }
              if (((iVar18 - iVar15 != 0 && iVar15 <= iVar18) &&
                  (iVar20 = (exr_header->data_window).min_y,
                  0xffffffff00000000 < ((long)iVar15 - (long)iVar20) - 0x80000000U)) &&
                 (iVar20 = iVar15 - iVar20, -1 < iVar20)) {
                _b = (size_t)exr_header->num_channels;
                bVar6 = DecodePixelData(exr_image->images,exr_header->requested_pixel_types,
                                        head + lVar13 + 8,(long)iVar19,exr_header->compression_type,
                                        exr_header->line_order,iVar1,iVar2,iVar1,(int)uVar21,iVar20,
                                        iVar18 - iVar15,channel_offset_list_00,_b,
                                        (EXRAttribute *)exr_header->channels,
                                        (size_t)&channel_offset_list,(EXRChannelInfo *)err,
                                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                        channel_offset_list_00);
                bVar6 = (bool)(!bVar6 | bVar16);
              }
            }
          }
        }
        bVar16 = bVar6;
      }
      if (bVar16) {
        iVar8 = -4;
        if ((EXRChannelInfo *)err != (EXRChannelInfo *)0x0) {
          std::__cxx11::string::append((char *)err);
        }
        goto LAB_001afbe2;
      }
LAB_001afb9f:
      for (lVar13 = 0; lVar13 < exr_header->num_channels; lVar13 = lVar13 + 1) {
        exr_header->pixel_types[lVar13] = exr_header->requested_pixel_types[lVar13];
      }
      exr_image->num_channels = iVar7;
      exr_image->width = iVar1;
      exr_image->height = iVar2;
      iVar8 = 0;
      goto LAB_001afbe2;
    }
    iVar8 = -4;
    if ((EXRChannelInfo *)err == (EXRChannelInfo *)0x0) goto LAB_001afbe2;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar9 = std::operator<<(local_1a8,"Image data size is zero or too large: width = ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar1);
    poVar9 = std::operator<<(poVar9,", height = ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar2);
    poVar9 = std::operator<<(poVar9,", channels = ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)err);
  }
  else if (exr_header->tile_size_x < 0) {
    iVar8 = -9;
    if ((EXRChannelInfo *)err == (EXRChannelInfo *)0x0) goto LAB_001afbe2;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar9 = std::operator<<(local_1a8,"Invalid tile size x : ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,exr_header->tile_size_x);
    std::operator<<(poVar9,"\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)err);
  }
  else {
    if (-1 < exr_header->tile_size_y) {
      if (exr_header->tile_level_mode != 2) {
        iVar15 = 0;
        pEVar25 = (EXRImage *)0x0;
        do {
          if (offset_data->num_x_levels <= iVar15) goto LAB_001afb9f;
          pTVar11 = exr_image;
          if (pEVar25 != (EXRImage *)0x0) {
            pTVar11 = (TEXRImage *)::operator_new(0x30);
            pEVar25->next_level = pTVar11;
            pTVar11->width = 0;
            pTVar11->height = 0;
            pTVar11->num_channels = 0;
            pTVar11->num_tiles = 0;
            pTVar11->level_x = 0;
            pTVar11->level_y = 0;
            pTVar11->images = (uchar **)0x0;
            pTVar11->tiles = (EXRTile *)0x0;
            pTVar11->next_level = (TEXRImage *)0x0;
            pTVar11 = pEVar25->next_level;
          }
          iVar20 = (exr_header->data_window).max_x - (exr_header->data_window).min_x;
          bVar14 = (byte)iVar15;
          iVar8 = 1 << (bVar14 & 0x1f);
          iVar18 = (iVar20 + 1) / iVar8;
          iVar18 = (uint)(iVar18 << (bVar14 & 0x1f) <= iVar20 && exr_header->tile_rounding_mode == 1
                         ) + iVar18;
          if (iVar18 < 2) {
            iVar18 = 1;
          }
          pTVar11->width = iVar18;
          iVar18 = (exr_header->data_window).max_y - (exr_header->data_window).min_y;
          iVar8 = (iVar18 + 1) / iVar8;
          iVar8 = (uint)(iVar8 << (bVar14 & 0x1f) <= iVar18 && exr_header->tile_rounding_mode == 1)
                  + iVar8;
          if (iVar8 < 2) {
            iVar8 = 1;
          }
          pTVar11->height = iVar8;
          pTVar11->level_x = iVar15;
          pTVar11->level_y = iVar15;
          iVar8 = DecodeTiledLevel(pTVar11,exr_header,offset_data,&channel_offset_list,iVar19,head,
                                   size,err);
          iVar15 = iVar15 + 1;
          pEVar25 = pTVar11;
        } while (iVar8 == 0);
        goto LAB_001afbe2;
      }
      pEVar25 = (EXRImage *)0x0;
      for (iVar15 = 0; iVar15 < offset_data->num_y_levels; iVar15 = iVar15 + 1) {
        _b = CONCAT44(uStack_1dc,1 << ((byte)iVar15 & 0x1f));
        iVar18 = 0;
        while (iVar18 < offset_data->num_x_levels) {
          pTVar11 = exr_image;
          if (pEVar25 != (EXRImage *)0x0) {
            pTVar11 = (TEXRImage *)::operator_new(0x30);
            pEVar25->next_level = pTVar11;
            pTVar11->width = 0;
            pTVar11->height = 0;
            pTVar11->num_channels = 0;
            pTVar11->num_tiles = 0;
            pTVar11->level_x = 0;
            pTVar11->level_y = 0;
            pTVar11->images = (uchar **)0x0;
            pTVar11->tiles = (EXRTile *)0x0;
            pTVar11->next_level = (TEXRImage *)0x0;
            pTVar11 = pEVar25->next_level;
          }
          iVar20 = (exr_header->data_window).max_x - (exr_header->data_window).min_x;
          iVar8 = (iVar20 + 1) / (1 << ((byte)iVar18 & 0x1f));
          iVar8 = (uint)(iVar8 << ((byte)iVar18 & 0x1f) <= iVar20 &&
                        exr_header->tile_rounding_mode == 1) + iVar8;
          if (iVar8 < 2) {
            iVar8 = 1;
          }
          pTVar11->width = iVar8;
          iVar20 = (exr_header->data_window).max_y - (exr_header->data_window).min_y;
          iVar8 = (iVar20 + 1) / b;
          iVar8 = (uint)(iVar8 << ((byte)iVar15 & 0x1f) <= iVar20 &&
                        exr_header->tile_rounding_mode == 1) + iVar8;
          if (iVar8 < 2) {
            iVar8 = 1;
          }
          pTVar11->height = iVar8;
          pTVar11->level_x = iVar18;
          pTVar11->level_y = iVar15;
          iVar8 = DecodeTiledLevel(pTVar11,exr_header,offset_data,&channel_offset_list,iVar19,head,
                                   size,err);
          iVar18 = iVar18 + 1;
          pEVar25 = pTVar11;
          if (iVar8 != 0) goto LAB_001afbe2;
        }
      }
      goto LAB_001afb9f;
    }
    iVar8 = -9;
    if ((EXRChannelInfo *)err == (EXRChannelInfo *)0x0) goto LAB_001afbe2;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar9 = std::operator<<(local_1a8,"Invalid tile size y : ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,exr_header->tile_size_y);
    std::operator<<(poVar9,"\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)err);
  }
  std::__cxx11::string::~string(local_200);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
LAB_001afbe2:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
  ;
  return iVar8;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const OffsetData& offset_data,
                       const unsigned char *head, const size_t size,
                       std::string *err) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;

#if TINYEXR_USE_ZFP
    tinyexr::ZFPCompressionParam zfp_compression_param;
    if (!FindZFPCompressionParam(&zfp_compression_param,
                                 exr_header->custom_attributes,
                                 int(exr_header->num_custom_attributes), err)) {
      return TINYEXR_ERROR_INVALID_HEADER;
    }
#endif
  }

  if (exr_header->data_window.max_x < exr_header->data_window.min_x ||
      exr_header->data_window.max_y < exr_header->data_window.min_y) {
    if (err) {
      (*err) += "Invalid data window.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  int data_width =
      exr_header->data_window.max_x - exr_header->data_window.min_x + 1;
  int data_height =
      exr_header->data_window.max_y - exr_header->data_window.min_y + 1;

  // Do not allow too large data_width and data_height. header invalid?
  {
    if ((data_width > TINYEXR_DIMENSION_THRESHOLD) || (data_height > TINYEXR_DIMENSION_THRESHOLD)) {
      if (err) {
        std::stringstream ss;
        ss << "data_with or data_height too large. data_width: " << data_width
           << ", "
           << "data_height = " << data_height << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
    if (exr_header->tiled) {
      if ((exr_header->tile_size_x > TINYEXR_DIMENSION_THRESHOLD) || (exr_header->tile_size_y > TINYEXR_DIMENSION_THRESHOLD)) {
        if (err) {
          std::stringstream ss;
          ss << "tile with or tile height too large. tile width: " << exr_header->tile_size_x
            << ", "
            << "tile height = " << exr_header->tile_size_y << std::endl;
          (*err) += ss.str();
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }
    }
  }

  const std::vector<tinyexr::tinyexr_uint64>& offsets = offset_data.offsets[0][0];
  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  if (!tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                     &channel_offset, num_channels,
                                     exr_header->channels)) {
    if (err) {
      (*err) += "Failed to compute channel layout.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  std::atomic<bool> invalid_data(false);
#else
  bool invalid_data(false);
#endif

  if (exr_header->tiled) {
    // value check
    if (exr_header->tile_size_x < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size x : " << exr_header->tile_size_x << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    if (exr_header->tile_size_y < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size y : " << exr_header->tile_size_y << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }
    if (exr_header->tile_level_mode != TINYEXR_TILE_RIPMAP_LEVELS) {
      EXRImage* level_image = NULL;
      for (int level = 0; level < offset_data.num_x_levels; ++level) {
        if (!level_image) {
          level_image = exr_image;
        } else {
          level_image->next_level = new EXRImage;
          InitEXRImage(level_image->next_level);
          level_image = level_image->next_level;
        }
        level_image->width =
          LevelSize(exr_header->data_window.max_x - exr_header->data_window.min_x + 1, level, exr_header->tile_rounding_mode);
        level_image->height =
          LevelSize(exr_header->data_window.max_y - exr_header->data_window.min_y + 1, level, exr_header->tile_rounding_mode);
        level_image->level_x = level;
        level_image->level_y = level;

        int ret = DecodeTiledLevel(level_image, exr_header,
          offset_data,
          channel_offset_list,
          pixel_data_size,
          head, size,
          err);
        if (ret != TINYEXR_SUCCESS) return ret;
      }
    } else {
      EXRImage* level_image = NULL;
      for (int level_y = 0; level_y < offset_data.num_y_levels; ++level_y)
        for (int level_x = 0; level_x < offset_data.num_x_levels; ++level_x) {
          if (!level_image) {
            level_image = exr_image;
          } else {
            level_image->next_level = new EXRImage;
            InitEXRImage(level_image->next_level);
            level_image = level_image->next_level;
          }

          level_image->width =
            LevelSize(exr_header->data_window.max_x - exr_header->data_window.min_x + 1, level_x, exr_header->tile_rounding_mode);
          level_image->height =
            LevelSize(exr_header->data_window.max_y - exr_header->data_window.min_y + 1, level_y, exr_header->tile_rounding_mode);
          level_image->level_x = level_x;
          level_image->level_y = level_y;

          int ret = DecodeTiledLevel(level_image, exr_header,
            offset_data,
            channel_offset_list,
            pixel_data_size,
            head, size,
            err);
          if (ret != TINYEXR_SUCCESS) return ret;
        }
    }
  } else {  // scanline format
    // Don't allow too large image(256GB * pixel_data_size or more). Workaround
    // for #104.
    size_t total_data_len =
        size_t(data_width) * size_t(data_height) * size_t(num_channels);
    const bool total_data_len_overflown =
        sizeof(void *) == 8 ? (total_data_len >= 0x4000000000) : false;
    if ((total_data_len == 0) || total_data_len_overflown) {
      if (err) {
        std::stringstream ss;
        ss << "Image data size is zero or too large: width = " << data_width
           << ", height = " << data_height << ", channels = " << num_channels
           << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
    std::vector<std::thread> workers;
    std::atomic<int> y_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_blocks)) {
      num_threads = int(num_blocks);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        int y = 0;
        while ((y = y_count++) < int(num_blocks)) {

#else

#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {

#endif
          size_t y_idx = static_cast<size_t>(y);

          if (offsets[y_idx] + sizeof(int) * 2 > size) {
            invalid_data = true;
          } else {
            // 4 byte: scan line
            // 4 byte: data size
            // ~     : pixel data(uncompressed or compressed)
            size_t data_size =
                size_t(size - (offsets[y_idx] + sizeof(int) * 2));
            const unsigned char *data_ptr =
                reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);

            int line_no;
            memcpy(&line_no, data_ptr, sizeof(int));
            int data_len;
            memcpy(&data_len, data_ptr + 4, sizeof(int));
            tinyexr::swap4(&line_no);
            tinyexr::swap4(&data_len);

            if (size_t(data_len) > data_size) {
              invalid_data = true;

            } else if ((line_no > (2 << 20)) || (line_no < -(2 << 20))) {
              // Too large value. Assume this is invalid
              // 2**20 = 1048576 = heuristic value.
              invalid_data = true;
            } else if (data_len == 0) {
              // TODO(syoyo): May be ok to raise the threshold for example
              // `data_len < 4`
              invalid_data = true;
            } else {
              // line_no may be negative.
              int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                           (exr_header->data_window.max_y + 1));

              int num_lines = end_line_no - line_no;

              if (num_lines <= 0) {
                invalid_data = true;
              } else {
                // Move to data addr: 8 = 4 + 4;
                data_ptr += 8;

                // Adjust line_no with data_window.bmin.y

                // overflow check
                tinyexr_int64 lno =
                    static_cast<tinyexr_int64>(line_no) -
                    static_cast<tinyexr_int64>(exr_header->data_window.min_y);
                if (lno > std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else if (lno < -std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else {
                  line_no -= exr_header->data_window.min_y;
                }

                if (line_no < 0) {
                  invalid_data = true;
                } else {
                  if (!tinyexr::DecodePixelData(
                          exr_image->images, exr_header->requested_pixel_types,
                          data_ptr, static_cast<size_t>(data_len),
                          exr_header->compression_type, exr_header->line_order,
                          data_width, data_height, data_width, y, line_no,
                          num_lines, static_cast<size_t>(pixel_data_size),
                          static_cast<size_t>(
                              exr_header->num_custom_attributes),
                          exr_header->custom_attributes,
                          static_cast<size_t>(exr_header->num_channels),
                          exr_header->channels, channel_offset_list)) {
                    invalid_data = true;
                  }
                }
              }
            }
          }

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }

    for (auto &t : workers) {
      t.join();
    }
#else
    }  // omp parallel
#endif
  }

  if (invalid_data) {
    if (err) {
      (*err) += "Invalid data found when decoding pixels.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}